

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BinaryExpr<const_int_&,_const_type_safe::basic_optional<type_safe::reference_optional_storage<int,_false>_>_&>
* __thiscall
Catch::ExprLhs<int_const&>::operator==
          (BinaryExpr<const_int_&,_const_type_safe::basic_optional<type_safe::reference_optional_storage<int,_false>_>_&>
           *__return_storage_ptr__,ExprLhs<int_const&> *this,
          basic_optional<type_safe::reference_optional_storage<int,_false>_> *rhs)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  StringRef local_38;
  
  if ((rhs->super_optional_storage<type_safe::reference_optional_storage<int,_false>_>).storage.
      pointer_ == (int *)0x0) {
    bVar3 = false;
  }
  else {
    piVar1 = *(int **)this;
    piVar2 = type_safe::basic_optional<type_safe::reference_optional_storage<int,_false>_>::value
                       (rhs);
    bVar3 = piVar2 == piVar1;
  }
  piVar1 = *(int **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0022ffb0;
  __return_storage_ptr__->m_lhs = piVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }